

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O3

void ppc_hash64_filter_pagesizes
               (PowerPCCPU_conflict3 *cpu,_func__Bool_void_ptr_uint32_t_uint32_t *cb,void *opaque)

{
  PPCHash64PageSize *pPVar1;
  PPCHash64SegmentPageSizes *pPVar2;
  PPCHash64Options *pPVar3;
  _Bool _Var4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  PPCHash64PageSize *pPVar9;
  uint uVar10;
  long lVar11;
  
  pPVar3 = cpu->hash64_opts;
  if (pPVar3 == (PPCHash64Options *)0x0) {
    __assert_fail("opts",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                  ,0x4db,
                  "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                 );
  }
  pPVar1 = pPVar3->sps[0].enc;
  uVar7 = 0;
  uVar6 = 0;
  bVar5 = false;
  pPVar9 = pPVar1;
  do {
    if (uVar7 < uVar6) {
      __assert_fail("n <= i",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                    ,0x4e3,
                    "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                   );
    }
    pPVar2 = pPVar3->sps + uVar7;
    if (pPVar2->page_shift == 0) break;
    lVar11 = 0;
    uVar10 = 0;
    do {
      lVar8 = (long)(int)uVar10;
      if (lVar11 < lVar8) {
        __assert_fail("m <= j",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                      ,0x4ec,
                      "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                     );
      }
      if (pPVar9[lVar11].page_shift == 0) break;
      _Var4 = (*cb)(opaque,pPVar2->page_shift,pPVar9[lVar11].page_shift);
      if (_Var4) {
        bVar5 = (bool)(bVar5 | 0xf < pPVar9[lVar11].page_shift);
        uVar10 = uVar10 + 1;
        pPVar2->enc[lVar8] = pPVar9[lVar11];
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    if (uVar10 < 8) {
      memset((void *)((long)&pPVar1[uVar7 * 9].page_shift + (ulong)(uVar10 * 8)),0,
             (ulong)(uVar10 * -8 + 0x40));
    }
    uVar6 = (ulong)(((int)uVar6 + 1) - (uint)(uVar10 == 0));
    uVar7 = uVar7 + 1;
    pPVar9 = pPVar9 + 9;
  } while (uVar7 != 8);
  uVar10 = (uint)uVar6;
  if (uVar10 < 8) {
    memset((void *)((long)&((PPCHash64SegmentPageSizes *)(pPVar3->sps[0].enc + -1))->page_shift +
                   (ulong)(uVar10 * 0x48)),0,(ulong)((7 - uVar10) * 0x48 + 0x48));
  }
  if (!bVar5) {
    *(byte *)&pPVar3->flags = (byte)pPVar3->flags & 0xfb;
  }
  return;
}

Assistant:

void ppc_hash64_filter_pagesizes(PowerPCCPU *cpu,
                                 bool (*cb)(void *, uint32_t, uint32_t),
                                 void *opaque)
{
    PPCHash64Options *opts = cpu->hash64_opts;
    int i;
    int n = 0;
    bool ci_largepage = false;

    assert(opts);

    n = 0;
    for (i = 0; i < ARRAY_SIZE(opts->sps); i++) {
        PPCHash64SegmentPageSizes *sps = &opts->sps[i];
        int j;
        int m = 0;

        assert(n <= i);

        if (!sps->page_shift) {
            break;
        }

        for (j = 0; j < ARRAY_SIZE(sps->enc); j++) {
            PPCHash64PageSize *ps = &sps->enc[j];

            assert(m <= j);
            if (!ps->page_shift) {
                break;
            }

            if (cb(opaque, sps->page_shift, ps->page_shift)) {
                if (ps->page_shift >= 16) {
                    ci_largepage = true;
                }
                sps->enc[m++] = *ps;
            }
        }

        /* Clear rest of the row */
        for (j = m; j < ARRAY_SIZE(sps->enc); j++) {
            memset(&sps->enc[j], 0, sizeof(sps->enc[j]));
        }

        if (m) {
            n++;
        }
    }

    /* Clear the rest of the table */
    for (i = n; i < ARRAY_SIZE(opts->sps); i++) {
        memset(&opts->sps[i], 0, sizeof(opts->sps[i]));
    }

    if (!ci_largepage) {
        opts->flags &= ~PPC_HASH64_CI_LARGEPAGE;
    }
}